

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.cc
# Opt level: O0

void __thiscall S2PointRegion::Encode(S2PointRegion *this,Encoder *encoder)

{
  double d;
  int local_1c;
  int i;
  Encoder *encoder_local;
  S2PointRegion *this_local;
  
  Encoder::Ensure(encoder,0x1e);
  Encoder::put8(encoder,'\x01');
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    d = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                  ((BasicVector<Vector3,_double,_3UL> *)&this->point_,local_1c);
    Encoder::putdouble(encoder,d);
  }
  Encoder::avail(encoder);
  return;
}

Assistant:

void S2PointRegion::Encode(Encoder* encoder) const {
  encoder->Ensure(30);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  for (int i = 0; i < 3; ++i) {
    encoder->putdouble(point_[i]);
  }
  S2_DCHECK_GE(encoder->avail(), 0);
}